

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>::clone_impl
          (clone_impl<boost::exception_detail::bad_exception_> *this,bad_exception_ *x)

{
  *(undefined ***)&this->field_0x30 = &PTR___cxa_pure_virtual_00123fb0;
  bad_exception_::bad_exception_(&this->super_bad_exception_,x);
  (this->super_bad_exception_).super_exception._vptr_exception = (_func_int **)0x1246b8;
  *(undefined8 *)&(this->super_bad_exception_).super_bad_exception = 0x1246e8;
  *(undefined8 *)&this->field_0x30 = 0x124728;
  copy_boost_exception((exception *)this,&x->super_exception);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }